

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::ShowMetricsWindow::Funcs::GetTableRect(ImGuiTable *table,int rect_type,int n)

{
  ImGuiTableColumn *pIVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  ImRect IVar8;
  ImRect IVar9;
  
  switch(rect_type) {
  case 0:
    return table->OuterRect;
  case 1:
    return table->InnerRect;
  case 2:
    return table->WorkRect;
  case 3:
    return table->HostClipRect;
  case 4:
    return table->InnerClipRect;
  case 5:
    return table->BgClipRect;
  case 6:
    pIVar1 = (table->Columns).Data;
    fVar5 = (table->InnerClipRect).Min.y;
    fVar6 = table->LastOuterHeight + fVar5;
    fVar4 = pIVar1[n].MinX;
    fVar3 = pIVar1[n].MaxX;
    break;
  case 7:
    pIVar1 = (table->Columns).Data;
    IVar2.y = (table->WorkRect).Min.y;
    IVar2.x = pIVar1[n].WorkMinX;
    fVar5 = pIVar1[n].WorkMaxX;
    fVar4 = (table->WorkRect).Max.y;
    goto LAB_0011ae49;
  case 8:
    pIVar1 = (table->Columns).Data;
    IVar9.Max = pIVar1[n].ClipRect.Max;
    IVar9.Min = pIVar1[n].ClipRect.Min;
    return IVar9;
  case 9:
    pIVar1 = (table->Columns).Data;
    fVar5 = (table->InnerClipRect).Min.y;
    fVar6 = table->LastFirstRowHeight + fVar5;
    fVar4 = pIVar1[n].WorkMinX;
    fVar3 = pIVar1[n].ContentMaxXHeadersUsed;
    break;
  case 10:
    pIVar1 = (table->Columns).Data;
    fVar5 = (table->InnerClipRect).Min.y;
    fVar6 = table->LastFirstRowHeight + fVar5;
    fVar4 = pIVar1[n].WorkMinX;
    fVar3 = pIVar1[n].ContentMaxXHeadersIdeal;
    break;
  case 0xb:
    pIVar1 = (table->Columns).Data;
    fVar5 = (table->InnerClipRect).Min.y;
    fVar6 = table->LastFirstRowHeight + fVar5;
    fVar4 = pIVar1[n].WorkMinX;
    fVar3 = pIVar1[n].ContentMaxXFrozen;
    break;
  case 0xc:
    pIVar1 = (table->Columns).Data;
    IVar2.y = (table->InnerClipRect).Min.y + table->LastFirstRowHeight;
    IVar2.x = pIVar1[n].WorkMinX;
    fVar5 = pIVar1[n].ContentMaxXUnfrozen;
    fVar4 = (table->InnerClipRect).Max.y;
LAB_0011ae49:
    IVar7.Max.y = fVar4;
    IVar7.Max.x = fVar5;
    IVar7.Min = IVar2;
    return IVar7;
  default:
    return (ImRect)ZEXT816(0);
  }
  IVar8.Max.y = fVar6;
  IVar8.Max.x = fVar3;
  IVar8.Min.y = fVar5;
  IVar8.Min.x = fVar4;
  return IVar8;
}

Assistant:

static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }